

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivySeq.c
# Opt level: O3

int Ivy_ManRewriteSeq(Ivy_Man_t *p,int fUseZeroCost,int fVerbose)

{
  Dec_Node_t *pDVar1;
  char cVar2;
  short sVar3;
  Dec_Node_t *pDVar4;
  anon_union_8_2_00c7e208_for_Dec_Node_t__2 aVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Rwt_Man_t *p_00;
  undefined8 *puVar9;
  void *pvVar10;
  long lVar11;
  void **ppvVar12;
  Ivy_Obj_t *pIVar13;
  Ivy_Obj_t *pIVar14;
  int *piVar15;
  Vec_Ptr_t *pVVar16;
  Dec_Graph_t *pDVar17;
  ulong uVar18;
  int *piVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  anon_union_8_2_00c7e208_for_Dec_Node_t__2 aVar23;
  anon_union_8_2_00c7e208_for_Dec_Node_t__2 aVar24;
  Ivy_Obj_t *pIVar25;
  void *pvVar26;
  int *piVar27;
  Ivy_Cut_t *pIVar28;
  ulong uVar29;
  bool bVar30;
  timespec ts;
  timespec local_110;
  int local_100;
  int local_fc;
  Ivy_Cut_t *local_f8;
  Rwt_Man_t *local_f0;
  uint local_e8;
  int local_e4;
  Dec_Graph_t *local_e0;
  Ivy_Man_t *local_d8;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  long local_c0;
  long local_b8;
  Ivy_Obj_t *local_b0;
  void *local_a8;
  long local_a0;
  ulong local_98;
  ulong local_90;
  char *local_88;
  Dec_Graph_t *local_80;
  Ivy_Obj_t *local_78;
  uint local_6c;
  long local_68;
  long local_60;
  undefined8 *local_58;
  long local_50;
  ulong local_48;
  Vec_Ptr_t *local_40;
  ulong local_38;
  
  local_cc = fUseZeroCost;
  iVar6 = clock_gettime(3,&local_110);
  if (iVar6 < 0) {
    local_68 = 1;
  }
  else {
    lVar21 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_110.tv_nsec),8);
    local_68 = ((lVar21 >> 7) - (lVar21 >> 0x3f)) + local_110.tv_sec * -1000000;
  }
  pVVar16 = p->vObjs;
  if (0 < pVVar16->nSize) {
    lVar21 = 0;
    do {
      pvVar10 = pVVar16->pArray[lVar21];
      if ((pvVar10 != (void *)0x0) && ((*(uint *)((long)pvVar10 + 8) & 0xf) == 4)) {
        *(uint *)((long)pvVar10 + 8) = *(uint *)((long)pvVar10 + 8) | 0x600;
        pVVar16 = p->vObjs;
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 < pVVar16->nSize);
  }
  iVar6 = 0;
  p_00 = Rwt_ManStart(0);
  p->pData = p_00;
  if (p_00 != (Rwt_Man_t *)0x0) {
    local_d0 = fVerbose;
    if (p->fFanout == 0) {
      Ivy_ManStartFanout(p);
    }
    pVVar16 = p->vObjs;
    local_48 = (ulong)pVVar16->nSize;
    if (0 < (long)local_48) {
      local_78 = &p->Ghost;
      uVar18 = 0;
      local_f0 = p_00;
      local_d8 = p;
      do {
        pIVar13 = (Ivy_Obj_t *)pVVar16->pArray[uVar18];
        if ((pIVar13 != (Ivy_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pIVar13->field_0x8 & 0xf) - 7)
           ) {
          if ((*(uint *)(((ulong)pIVar13->pFanin0 & 0xfffffffffffffffe) + 8) & 0xf) == 7) {
            __assert_fail("!Ivy_ObjIsBuf(Ivy_ObjFanin0(pNode))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivySeq.c"
                          ,0x56,"int Ivy_ManRewriteSeq(Ivy_Man_t *, int, int)");
          }
          if ((*(uint *)(((ulong)pIVar13->pFanin1 & 0xfffffffffffffffe) + 8) & 0xf) == 7) {
            __assert_fail("!Ivy_ObjIsBuf(Ivy_ObjFanin1(pNode))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivySeq.c"
                          ,0x57,"int Ivy_ManRewriteSeq(Ivy_Man_t *, int, int)");
          }
          if (local_48 <= uVar18) break;
          p_00->nNodesConsidered = p_00->nNodesConsidered + 1;
          local_98 = uVar18;
          iVar6 = clock_gettime(3,&local_110);
          if (iVar6 < 0) {
            lVar21 = 1;
          }
          else {
            lVar21 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_110.tv_nsec),8);
            lVar21 = ((lVar21 >> 7) - (lVar21 >> 0x3f)) + local_110.tv_sec * -1000000;
          }
          Ivy_CutComputeForNode(p,(Ivy_Obj_t *)(ulong)(uint)pIVar13->Id,5);
          iVar6 = clock_gettime(3,&local_110);
          if (iVar6 < 0) {
            lVar22 = -1;
          }
          else {
            lVar22 = local_110.tv_nsec / 1000 + local_110.tv_sec * 1000000;
          }
          p_00->timeCut = p_00->timeCut + lVar22 + lVar21;
          iVar6 = clock_gettime(3,&local_110);
          if (iVar6 < 0) {
            local_60 = 1;
          }
          else {
            lVar21 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_110.tv_nsec),8);
            local_60 = ((lVar21 >> 7) - (lVar21 >> 0x3f)) + local_110.tv_sec * -1000000;
          }
          puVar9 = (undefined8 *)malloc(0x10);
          *puVar9 = 100;
          pvVar10 = malloc(800);
          puVar9[1] = pvVar10;
          local_58 = puVar9;
          if (Ivy_CutComputeForNode::CutStore.nCuts < 2) {
            iVar6 = -1;
            uVar29 = 0;
          }
          else {
            local_e8 = 0;
            iVar6 = -1;
            lVar21 = 1;
            lVar22 = 0xc5876c;
            local_100 = -1;
            local_b0 = pIVar13;
            do {
              if (Ivy_CutComputeForNode::CutStore.pCuts[lVar21].nSize == 4) {
                local_f8 = Ivy_CutComputeForNode::CutStore.pCuts + lVar21;
                piVar15 = Ivy_CutComputeForNode::CutStore.pCuts[lVar21].pArray;
                lVar11 = -0x10;
                do {
                  uVar20 = *(int *)(lVar22 + 0x10 + lVar11) >> 8;
                  if (((int)uVar20 < 0) || (p->vObjs->nSize <= (int)uVar20)) goto LAB_00764b42;
                  if ((*(uint *)((long)p->vObjs->pArray[uVar20] + 8) & 0xf) == 7) {
                    if (lVar11 != 0) {
                      p_00->nCutsBad = p_00->nCutsBad + 1;
                      goto LAB_0076484c;
                    }
                    break;
                  }
                  lVar11 = lVar11 + 4;
                } while (lVar11 != 0);
                p_00->nCutsGood = p_00->nCutsGood + 1;
                local_c8 = iVar6;
                local_c0 = lVar22;
                local_b8 = lVar21;
                iVar6 = clock_gettime(3,&local_110);
                if (iVar6 < 0) {
                  lVar21 = 1;
                }
                else {
                  lVar21 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_110.tv_nsec),8);
                  lVar21 = ((lVar21 >> 7) - (lVar21 >> 0x3f)) + local_110.tv_sec * -1000000;
                }
                if ((*(uint *)&pIVar13->field_0x8 & 0xf) - 7 < 0xfffffffe) {
                  __assert_fail("Ivy_ObjIsNode(pObj)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivySeq.c"
                                ,0x25c,
                                "unsigned int Ivy_CutGetTruth(Ivy_Man_t *, Ivy_Obj_t *, int *, int)"
                               );
                }
                if (5 < local_f8->nSize) {
                  __assert_fail("nNums < 6",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivySeq.c"
                                ,0x25d,
                                "unsigned int Ivy_CutGetTruth(Ivy_Man_t *, Ivy_Obj_t *, int *, int)"
                               );
                }
                uVar20 = Ivy_CutGetTruth_rec(p,pIVar13->Id << 8,piVar15,(int)local_f8->nSize);
                iVar6 = clock_gettime(3,&local_110);
                if (iVar6 < 0) {
                  lVar22 = -1;
                }
                else {
                  lVar22 = local_110.tv_nsec / 1000 + local_110.tv_sec * 1000000;
                }
                local_f0->timeTruth = local_f0->timeTruth + lVar22 + lVar21;
                local_90 = (ulong)(uVar20 & 0xffff);
                local_88 = local_f0->pPerms4[local_f0->pPerms[local_90]];
                cVar2 = local_f0->pPhases[local_90];
                pVVar16 = local_f0->vFaninsCur;
                pVVar16->nSize = 0;
                sVar3 = local_f8->nSize;
                uVar20 = (uint)sVar3;
                if (pVVar16->nCap < (int)uVar20) {
                  if (pVVar16->pArray == (void **)0x0) {
                    ppvVar12 = (void **)malloc((long)(int)uVar20 << 3);
                  }
                  else {
                    ppvVar12 = (void **)realloc(pVVar16->pArray,(long)(int)uVar20 << 3);
                  }
                  pVVar16->pArray = ppvVar12;
                  pVVar16->nCap = uVar20;
                }
                pIVar13 = local_b0;
                p_00 = local_f0;
                if (0 < sVar3) {
                  uVar18 = 0;
                  do {
                    pVVar16->pArray[uVar18] = (void *)0x0;
                    uVar18 = uVar18 + 1;
                  } while (uVar20 != uVar18);
                }
                pVVar16->nSize = uVar20;
                sVar3 = local_f8->nSize;
                if (0 < (long)sVar3) {
                  lVar21 = 0;
                  do {
                    uVar20 = piVar15[local_88[lVar21]] >> 8;
                    if (((int)uVar20 < 0) || (p->vObjs->nSize <= (int)uVar20)) {
LAB_00764b42:
                      __assert_fail("i >= 0 && i < p->nSize",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                    }
                    piVar19 = (int *)p->vObjs->pArray[uVar20];
                    uVar20 = piVar19[2] & 0xf;
                    if ((((uVar20 - 7 < 0xfffffffe) && (uVar20 != 1)) && (uVar20 != 4)) &&
                       (*piVar19 != 0)) {
                      __assert_fail("Ivy_ObjIsNode(pFanin) || Ivy_ObjIsCi(pFanin) || Ivy_ObjIsConst1(pFanin)"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivySeq.c"
                                    ,199,
                                    "int Ivy_NodeRewriteSeq(Ivy_Man_t *, Rwt_Man_t *, Ivy_Obj_t *, int)"
                                   );
                    }
                    if (local_f0->vFaninsCur->nSize <= lVar21) {
                      __assert_fail("i >= 0 && i < p->nSize",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                                    ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
                    }
                    local_f0->vFaninsCur->pArray[lVar21] =
                         (void *)((ulong)piVar19 ^
                                 (ulong)(((uint)(int)cVar2 >> ((uint)lVar21 & 0x1f) & 1) != 0));
                    lVar21 = lVar21 + 1;
                  } while (sVar3 != lVar21);
                }
                local_6c = (int)cVar2;
                iVar6 = clock_gettime(3,&local_110);
                if (iVar6 < 0) {
                  lVar21 = 1;
                }
                else {
                  lVar21 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_110.tv_nsec),8);
                  lVar21 = ((lVar21 >> 7) - (lVar21 >> 0x3f)) + local_110.tv_sec * -1000000;
                }
                lVar22 = (long)p_00->vFaninsCur->nSize;
                if (0 < lVar22) {
                  ppvVar12 = p_00->vFaninsCur->pArray;
                  lVar11 = 0;
                  do {
                    piVar15 = (int *)(((ulong)ppvVar12[lVar11] & 0xfffffffffffffffe) + 0xc);
                    *piVar15 = *piVar15 + 1;
                    lVar11 = lVar11 + 1;
                  } while (lVar22 != lVar11);
                }
                Ivy_ManIncrementTravId(p);
                local_c4 = Ivy_ObjMffcLabel(p,pIVar13);
                lVar22 = (long)p_00->vFaninsCur->nSize;
                if (0 < lVar22) {
                  ppvVar12 = p_00->vFaninsCur->pArray;
                  lVar11 = 0;
                  do {
                    uVar18 = (ulong)ppvVar12[lVar11] & 0xfffffffffffffffe;
                    iVar6 = *(int *)(uVar18 + 0xc);
                    if (iVar6 < 1) {
                      __assert_fail("pObj->nRefs > 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivy.h"
                                    ,0x10a,"void Ivy_ObjRefsDec(Ivy_Obj_t *)");
                    }
                    *(int *)(uVar18 + 0xc) = iVar6 + -1;
                    lVar11 = lVar11 + 1;
                  } while (lVar22 != lVar11);
                }
                iVar6 = clock_gettime(3,&local_110);
                if (iVar6 < 0) {
                  lVar22 = -1;
                }
                else {
                  lVar22 = local_110.tv_nsec / 1000 + local_110.tv_sec * 1000000;
                }
                p_00->timeMffc = p_00->timeMffc + lVar22 + lVar21;
                iVar6 = clock_gettime(3,&local_110);
                if (iVar6 < 0) {
                  local_50 = 1;
                }
                else {
                  lVar21 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_110.tv_nsec),8);
                  local_50 = ((lVar21 >> 7) - (lVar21 >> 0x3f)) + local_110.tv_sec * -1000000;
                }
                if (p_00->vClasses->nSize <= (int)(uint)p_00->pMap[local_90]) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecVec.h"
                                ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
                }
                local_40 = p_00->vFaninsCur;
                pvVar10 = p_00->vClasses->pArray[p_00->pMap[local_90]];
                iVar6 = *(int *)((long)pvVar10 + 4);
                p_00->nSubgraphs = p_00->nSubgraphs + iVar6;
                pIVar28 = local_f8;
                if (iVar6 < 1) {
                  local_e0 = (Dec_Graph_t *)0x0;
                  iVar6 = local_100;
                }
                else {
                  local_e4 = -1;
                  lVar21 = 0;
                  local_e0 = (Dec_Graph_t *)0x0;
                  local_a8 = pvVar10;
                  do {
                    pDVar17 = *(Dec_Graph_t **)
                               (*(long *)(*(long *)((long)pvVar10 + 8) + lVar21 * 8) + 0x20);
                    Ivy_GraphPrepare(pDVar17,pIVar28,local_40,local_88);
                    local_fc = 0;
                    local_80 = pDVar17;
                    if (pDVar17->fConst == 0) {
                      uVar20 = pDVar17->nLeaves;
                      uVar18 = (ulong)uVar20;
                      if ((((uint)pDVar17->eRoot >> 1 & 0x3fffffff) < uVar20) ||
                         (pDVar17->nSize <= (int)uVar20)) goto LAB_007645f4;
                      local_fc = 0;
                      local_a0 = lVar21;
                      do {
                        pDVar4 = local_80->pNodes;
                        pDVar1 = pDVar4 + uVar18;
                        aVar23 = pDVar4[(uint)pDVar1->eEdge1 >> 1 & 0x3fffffff].field_2;
                        local_38 = uVar18;
                        if (pDVar4[(uint)pDVar1->eEdge0 >> 1 & 0x3fffffff].field_2.pFunc ==
                            (void *)0x0) {
                          aVar24.pFunc = (void *)0x0;
                          bVar30 = false;
                        }
                        else {
                          uVar20 = 0xffffffff;
                          aVar5 = pDVar4[(uint)pDVar1->eEdge0 >> 1 & 0x3fffffff].field_2;
                          do {
                            aVar24 = aVar5;
                            uVar20 = uVar20 + 1;
                            bVar30 = (*(uint *)&pDVar1->field_0x10 >> 0x11 & 0x1f) <= uVar20;
                            p = local_d8;
                            if (bVar30) break;
                            if ((Ivy_Obj_t *)((ulong)aVar24.pFunc & 0xfffffffffffffffe) ==
                                (Ivy_Obj_t *)0x0) goto LAB_00764b23;
                            *(uint *)&(local_d8->Ghost).field_0x8 =
                                 *(uint *)&(local_d8->Ghost).field_0x8 & 0xfffff9f0 | 0x604;
                            (local_d8->Ghost).pFanin0 =
                                 (Ivy_Obj_t *)((ulong)aVar24.pFunc & 0xfffffffffffffffe);
                            (local_d8->Ghost).pFanin1 = (Ivy_Obj_t *)0x0;
                            pIVar13 = Ivy_TableLookup(local_d8,local_78);
                            p = local_d8;
                            if (pIVar13 == (Ivy_Obj_t *)0x0) {
                              aVar24.pFunc = (void *)0x0;
                              break;
                            }
                            pIVar14 = (Ivy_Obj_t *)(ulong)(aVar24.iFunc & 1);
                            aVar24.pFunc = (void *)0x0;
                            aVar5.pFunc = (void *)((ulong)pIVar14 ^ (ulong)pIVar13);
                          } while (pIVar14 != pIVar13);
                        }
                        if (aVar23.pFunc == (void *)0x0) {
LAB_0076459f:
                          pIVar14 = (Ivy_Obj_t *)0x0;
                        }
                        else {
                          uVar20 = 0xffffffff;
                          do {
                            pIVar13 = local_b0;
                            pIVar28 = local_f8;
                            uVar20 = uVar20 + 1;
                            if ((*(uint *)&pDVar1->field_0x10 >> 0x16 & 0x1f) <= uVar20) {
                              if (!bVar30) goto LAB_0076459f;
                              piVar15 = (int *)((ulong)aVar24.pFunc & 0xfffffffffffffffe);
                              piVar19 = (int *)((ulong)aVar23.pFunc & 0xfffffffffffffffe);
                              if (((piVar15[2] & 0xfU) == 4) && ((piVar19[2] & 0xfU) == 4)) {
                                __assert_fail("!Ivy_ObjIsLatch(Ivy_Regular(pAnd0)) || !Ivy_ObjIsLatch(Ivy_Regular(pAnd1))"
                                              ,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivySeq.c"
                                              ,0x1ba,
                                              "int Ivy_GraphToNetworkSeqCountSeq(Ivy_Man_t *, Ivy_Obj_t *, Dec_Graph_t *, int)"
                                             );
                              }
                              pvVar10 = (void *)(ulong)((uint)pDVar1->eEdge0 & 1);
                              pIVar25 = (Ivy_Obj_t *)((ulong)aVar24.pFunc ^ (ulong)pvVar10);
                              pvVar26 = (void *)(ulong)((uint)pDVar1->eEdge1 & 1);
                              pIVar14 = (Ivy_Obj_t *)((ulong)aVar23.pFunc ^ (ulong)pvVar26);
                              if (((piVar15 == piVar19) || (*piVar15 == 0)) || (*piVar19 == 0)) {
                                pIVar14 = Ivy_And(p,pIVar25,pIVar14);
                                pIVar28 = local_f8;
                              }
                              else {
                                piVar27 = piVar19;
                                if (aVar23.pFunc == pvVar26) {
                                  piVar27 = (int *)0x0;
                                }
                                if (piVar15 == piVar27) {
LAB_00764b23:
                                  __assert_fail("Type == IVY_PI || Ivy_Regular(p0) != Ivy_Regular(p1)"
                                                ,
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivy.h"
                                                ,0x139,
                                                "Ivy_Obj_t *Ivy_ObjCreateGhost(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Type_t, Ivy_Init_t)"
                                               );
                                }
                                *(uint *)&(p->Ghost).field_0x8 =
                                     *(uint *)&(p->Ghost).field_0x8 & 0xfffff9f0 | 5;
                                (p->Ghost).pFanin0 = pIVar25;
                                (p->Ghost).pFanin1 = pIVar14;
                                if (aVar23.pFunc != pvVar26) {
                                  iVar6 = 0;
                                  if (aVar24.pFunc != pvVar10) {
                                    iVar6 = *piVar15;
                                  }
                                  if (*piVar19 < iVar6) {
                                    (p->Ghost).pFanin0 = pIVar14;
                                    (p->Ghost).pFanin1 = pIVar25;
                                  }
                                }
                                pIVar14 = Ivy_TableLookup(p,local_78);
                              }
                              lVar21 = local_a0;
                              pvVar10 = local_a8;
                              p_00 = local_f0;
                              if (pIVar13 == (Ivy_Obj_t *)((ulong)pIVar14 & 0xfffffffffffffffe))
                              goto LAB_00764622;
                              if (pIVar14 == (Ivy_Obj_t *)0x0) goto LAB_0076459f;
                              if (((Ivy_Obj_t *)((ulong)pIVar14 & 0xfffffffffffffffe))->TravId !=
                                  p->nTravIds) goto LAB_007645b5;
                              break;
                            }
                            if ((Ivy_Obj_t *)((ulong)aVar23.pFunc & 0xfffffffffffffffe) ==
                                (Ivy_Obj_t *)0x0) goto LAB_00764b23;
                            *(uint *)&(p->Ghost).field_0x8 =
                                 *(uint *)&(p->Ghost).field_0x8 & 0xfffff9f0 | 0x604;
                            (p->Ghost).pFanin0 =
                                 (Ivy_Obj_t *)((ulong)aVar23.pFunc & 0xfffffffffffffffe);
                            (p->Ghost).pFanin1 = (Ivy_Obj_t *)0x0;
                            pIVar13 = Ivy_TableLookup(p,local_78);
                            if (pIVar13 == (Ivy_Obj_t *)0x0) goto LAB_0076459f;
                            pIVar25 = (Ivy_Obj_t *)(ulong)(aVar23.iFunc & 1);
                            aVar23.pFunc = (void *)((ulong)pIVar25 ^ (ulong)pIVar13);
                            pIVar14 = (Ivy_Obj_t *)0x0;
                          } while (pIVar25 != pIVar13);
                        }
                        lVar21 = local_a0;
                        pvVar10 = local_a8;
                        pIVar28 = local_f8;
                        p_00 = local_f0;
                        if (local_c4 <= local_fc) goto LAB_00764622;
                        local_fc = local_fc + 1;
LAB_007645b5:
                        (pDVar1->field_2).pFunc = pIVar14;
                        uVar18 = local_38 + 1;
                      } while ((long)uVar18 < (long)local_80->nSize);
                      lVar21 = local_a0;
                      pvVar10 = local_a8;
                      pIVar28 = local_f8;
                      p_00 = local_f0;
                      if (local_fc != -1) goto LAB_007645f4;
                    }
                    else {
LAB_007645f4:
                      iVar6 = local_c4 - local_fc;
                      if (local_c4 < local_fc) {
                        __assert_fail("nNodesSaved >= nNodesAdded",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivySeq.c"
                                      ,0x153,
                                      "Dec_Graph_t *Rwt_CutEvaluateSeq(Ivy_Man_t *, Rwt_Man_t *, Ivy_Obj_t *, Ivy_Cut_t *, char *, Vec_Ptr_t *, int, int *, unsigned int)"
                                     );
                      }
                      if (local_e4 < iVar6) {
                        local_e0 = local_80;
                      }
                      if (local_e4 <= iVar6) {
                        local_e4 = iVar6;
                      }
                    }
LAB_00764622:
                    lVar21 = lVar21 + 1;
                  } while (lVar21 < *(int *)((long)pvVar10 + 4));
                  iVar6 = local_e4;
                  if (local_e4 == -1) {
                    local_e0 = (Dec_Graph_t *)0x0;
                    iVar6 = local_100;
                  }
                }
                local_100 = iVar6;
                iVar6 = clock_gettime(3,&local_110);
                if (iVar6 < 0) {
                  lVar21 = -1;
                }
                else {
                  lVar21 = local_110.tv_nsec / 1000 + local_110.tv_sec * 1000000;
                }
                p_00->timeEval = p_00->timeEval + lVar21 + local_50;
                lVar21 = local_b8;
                lVar22 = local_c0;
                pIVar13 = local_b0;
                iVar6 = local_c8;
                if ((local_e0 != (Dec_Graph_t *)0x0) && (local_c8 < local_100)) {
                  p_00->pGraph = local_e0;
                  p_00->pCut = pIVar28;
                  p_00->pPerm = local_88;
                  p_00->fCompl = local_6c >> 4 & 1;
                  p_00->vFanins->nSize = 0;
                  pVVar16 = p_00->vFaninsCur;
                  if (pVVar16->nSize < 1) {
                    local_e8 = (uint)local_90;
                    iVar6 = local_100;
                  }
                  else {
                    lVar11 = 0;
                    do {
                      pvVar10 = pVVar16->pArray[lVar11];
                      pVVar16 = p_00->vFanins;
                      uVar20 = pVVar16->nSize;
                      if (uVar20 == pVVar16->nCap) {
                        if ((int)uVar20 < 0x10) {
                          if (pVVar16->pArray == (void **)0x0) {
                            ppvVar12 = (void **)malloc(0x80);
                          }
                          else {
                            ppvVar12 = (void **)realloc(pVVar16->pArray,0x80);
                          }
                          pVVar16->pArray = ppvVar12;
                          pVVar16->nCap = 0x10;
                          lVar21 = local_b8;
                          lVar22 = local_c0;
                        }
                        else {
                          if (pVVar16->pArray == (void **)0x0) {
                            ppvVar12 = (void **)malloc((ulong)uVar20 << 4);
                          }
                          else {
                            ppvVar12 = (void **)realloc(pVVar16->pArray,(ulong)uVar20 << 4);
                          }
                          pVVar16->pArray = ppvVar12;
                          pVVar16->nCap = uVar20 * 2;
                          lVar21 = local_b8;
                          lVar22 = local_c0;
                        }
                      }
                      else {
                        ppvVar12 = pVVar16->pArray;
                      }
                      iVar6 = pVVar16->nSize;
                      pVVar16->nSize = iVar6 + 1;
                      ppvVar12[iVar6] = pvVar10;
                      lVar11 = lVar11 + 1;
                      pVVar16 = local_f0->vFaninsCur;
                      p_00 = local_f0;
                    } while (lVar11 < pVVar16->nSize);
                    local_e8 = (uint)local_90;
                    p = local_d8;
                    pIVar13 = local_b0;
                    iVar6 = local_100;
                  }
                }
              }
LAB_0076484c:
              lVar21 = lVar21 + 1;
              lVar22 = lVar22 + 0x24;
            } while (lVar21 < Ivy_CutComputeForNode::CutStore.nCuts);
            pvVar10 = (void *)local_58[1];
            uVar29 = (ulong)local_e8;
          }
          if (pvVar10 != (void *)0x0) {
            free(pvVar10);
          }
          free(local_58);
          iVar7 = clock_gettime(3,&local_110);
          if (iVar7 < 0) {
            lVar21 = -1;
          }
          else {
            lVar21 = local_110.tv_nsec / 1000 + local_110.tv_sec * 1000000;
          }
          p_00->timeRes = p_00->timeRes + lVar21 + local_60;
          uVar18 = local_98;
          if (iVar6 != -1) {
            Ivy_GraphPrepare((Dec_Graph_t *)p_00->pGraph,(Ivy_Cut_t *)p_00->pCut,p_00->vFanins,
                             p_00->pPerm);
            p_00->nScores[p_00->pMap[uVar29]] = p_00->nScores[p_00->pMap[uVar29]] + 1;
            p_00->nNodesGained = p_00->nNodesGained + iVar6;
            uVar18 = local_98;
            if ((local_cc != 0) || (0 < iVar6)) {
              p_00->nNodesRewritten = p_00->nNodesRewritten + 1;
              if ((0 < iVar6) || (local_cc != 0 && iVar6 == 0)) {
                pDVar17 = (Dec_Graph_t *)Rwt_ManReadDecs(p_00);
                iVar7 = Rwt_ManReadCompl(p_00);
                iVar8 = clock_gettime(3,&local_110);
                if (iVar8 < 0) {
                  lVar21 = 1;
                }
                else {
                  lVar21 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_110.tv_nsec),8);
                  lVar21 = ((lVar21 >> 7) - (lVar21 >> 0x3f)) + local_110.tv_sec * -1000000;
                }
                if (iVar7 == 0) {
                  Ivy_GraphUpdateNetworkSeq(p,pIVar13,pDVar17,iVar6);
                }
                else {
                  *(byte *)&pDVar17->eRoot = *(byte *)&pDVar17->eRoot ^ 1;
                  Ivy_GraphUpdateNetworkSeq(p,pIVar13,pDVar17,iVar6);
                  *(byte *)&pDVar17->eRoot = *(byte *)&pDVar17->eRoot ^ 1;
                }
                iVar6 = clock_gettime(3,&local_110);
                p_00 = local_f0;
                if (iVar6 < 0) {
                  lVar22 = -1;
                }
                else {
                  lVar22 = local_110.tv_nsec / 1000 + local_110.tv_sec * 1000000;
                }
                Rwt_ManAddTimeUpdate(local_f0,lVar22 + lVar21);
                uVar18 = local_98;
              }
            }
          }
        }
        uVar18 = uVar18 + 1;
        pVVar16 = p->vObjs;
      } while ((long)uVar18 < (long)pVVar16->nSize);
    }
    iVar7 = clock_gettime(3,&local_110);
    iVar6 = local_d0;
    if (iVar7 < 0) {
      lVar21 = -1;
    }
    else {
      lVar21 = local_110.tv_nsec / 1000 + local_110.tv_sec * 1000000;
    }
    Rwt_ManAddTimeTotal(p_00,lVar21 + local_68);
    if (iVar6 != 0) {
      Rwt_ManPrintStats(p_00);
    }
    Rwt_ManStop(p_00);
    p->pData = (void *)0x0;
    Ivy_ManResetLevels(p);
    iVar7 = Ivy_ManCheck(p);
    iVar6 = 1;
    if (iVar7 == 0) {
      puts("Ivy_ManRewritePre(): The check has failed.");
    }
  }
  return iVar6;
}

Assistant:

int Ivy_ManRewriteSeq( Ivy_Man_t * p, int fUseZeroCost, int fVerbose )
{ 
    Rwt_Man_t * pManRwt;
    Ivy_Obj_t * pNode;
    int i, nNodes, nGain;
    abctime clk, clkStart = Abc_Clock();

    // set the DC latch values
    Ivy_ManForEachLatch( p, pNode, i )
        pNode->Init = IVY_INIT_DC;
    // start the rewriting manager
    pManRwt = Rwt_ManStart( 0 );
    p->pData = pManRwt;
    if ( pManRwt == NULL )
        return 0; 
    // create fanouts
    if ( p->fFanout == 0 )
        Ivy_ManStartFanout( p );
    // resynthesize each node once
    nNodes = Ivy_ManObjIdMax(p);
    Ivy_ManForEachNode( p, pNode, i )
    {
        assert( !Ivy_ObjIsBuf(pNode) );
        assert( !Ivy_ObjIsBuf(Ivy_ObjFanin0(pNode)) );
        assert( !Ivy_ObjIsBuf(Ivy_ObjFanin1(pNode)) );
        // fix the fanin buffer problem
//        Ivy_NodeFixBufferFanins( p, pNode );
//        if ( Ivy_ObjIsBuf(pNode) )
//            continue;
        // stop if all nodes have been tried once
        if ( i > nNodes ) 
            break;
        // for each cut, try to resynthesize it
        nGain = Ivy_NodeRewriteSeq( p, pManRwt, pNode, fUseZeroCost );
        if ( nGain > 0 || (nGain == 0 && fUseZeroCost) )
        {
            Dec_Graph_t * pGraph = (Dec_Graph_t *)Rwt_ManReadDecs(pManRwt);
            int fCompl           = Rwt_ManReadCompl(pManRwt);
            // complement the FF if needed
clk = Abc_Clock();
            if ( fCompl ) Dec_GraphComplement( pGraph );
            Ivy_GraphUpdateNetworkSeq( p, pNode, pGraph, nGain );
            if ( fCompl ) Dec_GraphComplement( pGraph );
Rwt_ManAddTimeUpdate( pManRwt, Abc_Clock() - clk );
        }
    }
Rwt_ManAddTimeTotal( pManRwt, Abc_Clock() - clkStart );
    // print stats
    if ( fVerbose )
        Rwt_ManPrintStats( pManRwt );
    // delete the managers
    Rwt_ManStop( pManRwt );
    p->pData = NULL;
    // fix the levels
    Ivy_ManResetLevels( p );
//    if ( Ivy_ManCheckFanoutNums(p) )
//        printf( "Ivy_ManRewritePre(): The check has failed.\n" );
    // check
    if ( !Ivy_ManCheck(p) )
        printf( "Ivy_ManRewritePre(): The check has failed.\n" );
    return 1;
}